

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void __thiscall fmt::v6::internal::bigint::subtract_aligned(bigint *this,bigint *other)

{
  uint *puVar1;
  uint *puVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  sVar3 = (other->bigits_).super_buffer<unsigned_int>.size_;
  puVar1 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
  lVar7 = (long)(other->exp_ - this->exp_);
  puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  lVar4 = lVar7 << 0x20;
  uVar5 = 0;
  for (uVar8 = 0; (uint)sVar3 != uVar8; uVar8 = uVar8 + 1) {
    lVar6 = (ulong)puVar2[lVar7 + uVar8] - ((ulong)uVar5 + (ulong)puVar1[uVar8]);
    puVar2[lVar7 + uVar8] = (uint)lVar6;
    lVar4 = lVar4 + 0x100000000;
    uVar5 = (uint)((ulong)lVar6 >> 0x3f);
  }
  puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
  while (uVar5 != 0) {
    lVar7 = (ulong)*(uint *)((long)puVar1 + (lVar4 >> 0x1e)) - (ulong)uVar5;
    *(int *)((long)puVar1 + (lVar4 >> 0x1e)) = (int)lVar7;
    uVar5 = (uint)((ulong)lVar7 >> 0x3f);
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (int j = 0, n = static_cast<int>(other.bigits_.size()); j != n;
         ++i, ++j) {
      subtract_bigits(i, other.bigits_[j], borrow);
    }
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }